

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugins.h
# Opt level: O2

void __thiscall
f8n::plugin::Plugins::QueryFunction<void(*)(f8n::sdk::IPreferences*)>
          (Plugins *this,string *functionName,
          function<void_(f8n::sdk::IPlugin_*,_void_(*)(f8n::sdk::IPreferences_*))> *handler)

{
  __shared_ptr<f8n::plugin::Plugins::Descriptor,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  int iVar3;
  _func_void_IPreferences_ptr *__args_1;
  __shared_ptr<f8n::plugin::Plugins::Descriptor,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  shared_ptr<f8n::plugin::Plugins::Descriptor> descriptor;
  unique_lock<std::mutex> lock;
  
  std::unique_lock<std::mutex>::unique_lock(&lock,&this->mutex);
  p_Var1 = &((this->plugins).
             super__Vector_base<std::shared_ptr<f8n::plugin::Plugins::Descriptor>,_std::allocator<std::shared_ptr<f8n::plugin::Plugins::Descriptor>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<f8n::plugin::Plugins::Descriptor,_(__gnu_cxx::_Lock_policy)2>;
  for (p_Var4 = &((this->plugins).
                  super__Vector_base<std::shared_ptr<f8n::plugin::Plugins::Descriptor>,_std::allocator<std::shared_ptr<f8n::plugin::Plugins::Descriptor>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<f8n::plugin::Plugins::Descriptor,_(__gnu_cxx::_Lock_policy)2>;
      p_Var4 != p_Var1; p_Var4 = p_Var4 + 1) {
    std::__shared_ptr<f8n::plugin::Plugins::Descriptor,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&descriptor.
                super___shared_ptr<f8n::plugin::Plugins::Descriptor,_(__gnu_cxx::_Lock_policy)2>,
               p_Var4);
    peVar2 = (this->prefs).super___shared_ptr<f8n::sdk::IPreferences,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    iVar3 = (*peVar2->_vptr_IPreferences[1])
                      (peVar2,((descriptor.
                                super___shared_ptr<f8n::plugin::Plugins::Descriptor,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->key)._M_dataplus._M_p,1);
    if ((char)iVar3 != '\0') {
      __args_1 = (_func_void_IPreferences_ptr *)
                 dlsym((descriptor.
                        super___shared_ptr<f8n::plugin::Plugins::Descriptor,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->nativeHandle,(functionName->_M_dataplus)._M_p);
      if (__args_1 != (_func_void_IPreferences_ptr *)0x0) {
        std::function<void_(f8n::sdk::IPlugin_*,_void_(*)(f8n::sdk::IPreferences_*))>::operator()
                  (handler,(descriptor.
                            super___shared_ptr<f8n::plugin::Plugins::Descriptor,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->plugin,__args_1);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&descriptor.
                super___shared_ptr<f8n::plugin::Plugins::Descriptor,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  return;
}

Assistant:

void QueryFunction(
                const std::string& functionName,
                std::function<void(f8n::sdk::IPlugin*, T)> handler)
            {
                std::unique_lock<std::mutex> lock(this->mutex);

                for (std::shared_ptr<Descriptor> descriptor : this->plugins) {
                    if (prefs->GetBool(descriptor->key.c_str(), true)) { /* if enabled by prefs */
                        T funcPtr =
#ifdef WIN32
                            (T) GetProcAddress((HMODULE)(descriptor->nativeHandle), functionName.c_str());
#else
                            (T)dlsym(descriptor->nativeHandle, functionName.c_str());
#endif
                        if (funcPtr) {
                            handler(descriptor->plugin, funcPtr);
                        }
                    }
                }
            }